

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::opTypeCast(PrintC *this,PcodeOp *op)

{
  HighVariable *this_00;
  
  if ((this->super_PrintLanguage).field_0xff == '\0') {
    PrintLanguage::pushOp(&this->super_PrintLanguage,&typecast,op);
    this_00 = Varnode::getHigh(op->output);
    HighVariable::updateType(this_00);
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[1])(this,this_00->type);
  }
  PrintLanguage::pushVnImplied
            (&this->super_PrintLanguage,
             *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start,op,(this->super_PrintLanguage).mods);
  return;
}

Assistant:

void PrintC::opTypeCast(const PcodeOp *op)

{
  if (!option_nocasts) {
    pushOp(&typecast,op);
    pushType(op->getOut()->getHigh()->getType());
  }
  pushVnImplied(op->getIn(0),op,mods);
}